

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void __thiscall Packet::respondToGet(Packet *this,socket *socket,FlaggedValue *fv,bool found)

{
  size_type sVar1;
  byte in_CL;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  Packet *in_RDI;
  const_buffers_1 cVar2;
  exception *e;
  uchar res [28];
  type *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98 [16];
  uchar local_30 [23];
  byte local_19;
  vector<char,_std::allocator<char>_> *local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_19 = in_CL & 1;
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[10] = '\0';
  local_30[0xb] = '\0';
  local_30[0xc] = '\0';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\x01';
  local_30[0x10] = '\0';
  local_30[0x11] = '\0';
  local_30[0x12] = '\0';
  local_30[0x13] = '\0';
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(in_RDX);
  writeUInt32LE(in_RDI,local_30,(int)sVar1 + 4);
  writeUInt32LE(in_RDI,local_30 + 4,in_RDI->opaque);
  writeUInt32LE(in_RDI,local_30 + 0x10,
                *(uint32_t *)&local_18[1].super__Vector_base<char,_std::allocator<char>_>._M_impl);
  boost::asio::buffer<unsigned_char,28ul>((uchar (*) [28])0x15cbc9);
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
            (in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_,
             in_stack_ffffffffffffff90);
  cVar2 = boost::asio::buffer<char,std::allocator<char>>(local_10);
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1>
            ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)cVar2.super_const_buffer.size_,(const_buffers_1 *)cVar2.super_const_buffer.data_,
             in_stack_ffffffffffffff90);
  return;
}

Assistant:

void Packet::respondToGet(socket& socket, const FlaggedValue& fv, bool found) {
  unsigned char res[28] = { 0x81, 0x00, 0x00, 0x00, 0x04, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00 };
  writeUInt32LE(&res[8], fv.value.size() + 4);
  writeUInt32LE(&res[12], opaque);
  writeUInt32LE(&res[24], fv.flags);
  // Section 4.1:
  // If the status code of a response packet is non-nil, the body of the packet
  // will contain a textual error message.
  if (!found) {
    res[7] = 0x01;
  }
  try {
    boost::asio::write(socket, boost::asio::buffer(res));
    boost::asio::write(socket, boost::asio::buffer(fv.value));
  } catch (std::exception& e) {
    std::cerr << e.what() << std::endl;
  }
}